

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::TrackUnallocated(Recycler *this,char *address,char *endAddress,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TrackerData *pTVar4;
  
  if ((DAT_015bf421 == '\0') && (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0)) {
    CCLock::Enter(&this->trackerCriticalSection->super_CCLock);
    if (address + sizeCat <= endAddress) {
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        pTVar4 = GetTrackerData(this,address);
        if (pTVar4 != (TrackerData *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x209e,"(GetTrackerData(address) == nullptr)",
                             "GetTrackerData(address) == nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        SetTrackerData(this,address,&TrackerData::EmptyData);
        address = address + sizeCat;
      } while (address + sizeCat <= endAddress);
    }
    CCLock::Leave(&this->trackerCriticalSection->super_CCLock);
    return;
  }
  return;
}

Assistant:

void
Recycler::TrackUnallocated(__in char* address, __in  char *endAddress, size_t sizeCat)
{
    if (!CONFIG_FLAG(KeepRecyclerTrackData))
    {
        if (this->trackerDictionary != nullptr)
        {
            trackerCriticalSection->Enter();
            while (address + sizeCat <= endAddress)
            {
                Assert(GetTrackerData(address) == nullptr);
                SetTrackerData(address, &TrackerData::EmptyData);
                address += sizeCat;
            }
            trackerCriticalSection->Leave();
        }
    }
}